

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.c
# Opt level: O0

void free_mem_pool(mem_pool *mem_pool)

{
  mem_pool *pmVar1;
  mem_pool *prev;
  mem_pool *next;
  mem_pool *cur;
  mem_pool *mem_pool_local;
  
  next = mem_pool->next;
  while (next != (mem_pool *)0x0) {
    pmVar1 = next->next;
    free(next);
    next = pmVar1;
  }
  next = mem_pool->prev;
  while (next != (mem_pool *)0x0) {
    pmVar1 = next->prev;
    free(next);
    next = pmVar1;
  }
  free(mem_pool);
  return;
}

Assistant:

void free_mem_pool(struct mem_pool* mem_pool) {
    struct mem_pool* cur = mem_pool->next;
    while (cur) {
        struct mem_pool* next = cur->next;
        free(cur);
        cur = next;
    }
    cur = mem_pool->prev;
    while (cur) {
        struct mem_pool* prev = cur->prev;
        free(cur);
        cur = prev;
    }
    free(mem_pool);
}